

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anna_hashmap.h
# Opt level: O3

pair<anna_hashmap<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
* __thiscall
anna_hashmap<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::insert(pair<anna_hashmap<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
         *__return_storage_ptr__,
        anna_hashmap<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this,pair<std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *value)

{
  pointer puVar1;
  _Fwd_list_node_base *p_Var2;
  _Fwd_list_node_base *p_Var3;
  size_t sVar4;
  _Fwd_list_impl _Var5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  pointer pfVar9;
  array<int,_4UL> *__range2;
  undefined1 auVar10 [16];
  undefined1 local_48 [16];
  pointer local_38;
  
  pfVar9 = (this->table_).
           super__Vector_base<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->table_).
                super__Vector_base<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar9;
  uVar7 = lVar8 >> 3;
  if (10 < this->size_ / uVar7) {
    rehash(this,lVar8 >> 2);
    pfVar9 = (this->table_).
             super__Vector_base<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (long)(this->table_).
                  super__Vector_base<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::allocator<std::forward_list<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar9 >> 3;
  }
  uVar7 = (ulong)(long)((value->first)._M_elems[3] ^ (value->first)._M_elems[1] ^
                       (value->first)._M_elems[2] ^ (value->first)._M_elems[0]) % uVar7 & 0xffffffff
  ;
  _Var5._M_head._M_next =
       pfVar9[uVar7].
       super__Fwd_list_base<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ._M_impl._M_head;
  if (_Var5._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    sVar4 = 0;
    do {
      auVar10[0] = -(*(char *)&((_Fwd_list_node_base *)((long)_Var5._M_head._M_next + 8))->_M_next
                    == (char)(value->first)._M_elems[0]);
      auVar10[1] = -(*(char *)((long)_Var5._M_head._M_next + 8U + 1) ==
                    *(char *)((long)(value->first)._M_elems + 1));
      auVar10[2] = -(*(char *)((long)_Var5._M_head._M_next + 8U + 2) ==
                    *(char *)((long)(value->first)._M_elems + 2));
      auVar10[3] = -(*(char *)((long)_Var5._M_head._M_next + 8U + 3) ==
                    *(char *)((long)(value->first)._M_elems + 3));
      auVar10[4] = -(*(char *)((long)_Var5._M_head._M_next + 8U + 4) ==
                    (char)(value->first)._M_elems[1]);
      auVar10[5] = -(*(char *)((long)_Var5._M_head._M_next + 8U + 5) ==
                    *(char *)((long)(value->first)._M_elems + 5));
      auVar10[6] = -(*(char *)((long)_Var5._M_head._M_next + 8U + 6) ==
                    *(char *)((long)(value->first)._M_elems + 6));
      auVar10[7] = -(*(char *)((long)_Var5._M_head._M_next + 8U + 7) ==
                    *(char *)((long)(value->first)._M_elems + 7));
      auVar10[8] = -(*(char *)&((_Fwd_list_node_base *)((long)_Var5._M_head._M_next + 0x10))->
                               _M_next == (char)(value->first)._M_elems[2]);
      auVar10[9] = -(*(char *)((long)_Var5._M_head._M_next + 0x10U + 1) ==
                    *(char *)((long)(value->first)._M_elems + 9));
      auVar10[10] = -(*(char *)((long)_Var5._M_head._M_next + 0x10U + 2) ==
                     *(char *)((long)(value->first)._M_elems + 10));
      auVar10[0xb] = -(*(char *)((long)_Var5._M_head._M_next + 0x10U + 3) ==
                      *(char *)((long)(value->first)._M_elems + 0xb));
      auVar10[0xc] = -(*(char *)((long)_Var5._M_head._M_next + 0x10U + 4) ==
                      (char)(value->first)._M_elems[3]);
      auVar10[0xd] = -(*(char *)((long)_Var5._M_head._M_next + 0x10U + 5) ==
                      *(char *)((long)(value->first)._M_elems + 0xd));
      auVar10[0xe] = -(*(char *)((long)_Var5._M_head._M_next + 0x10U + 6) ==
                      *(char *)((long)(value->first)._M_elems + 0xe));
      auVar10[0xf] = -(*(char *)((long)_Var5._M_head._M_next + 0x10U + 7) ==
                      *(char *)((long)(value->first)._M_elems + 0xf));
      if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
        bVar6 = false;
        goto LAB_00106f3e;
      }
      _Var5._M_head._M_next =
           (_Fwd_list_node_base)((_Fwd_list_node_base *)_Var5._M_head._M_next)->_M_next;
      sVar4 = sVar4 + 1;
    } while (_Var5._M_head._M_next != (_Fwd_list_node_base *)0x0);
  }
  p_Var2 = *(_Fwd_list_node_base **)(value->first)._M_elems;
  p_Var3 = *(_Fwd_list_node_base **)((value->first)._M_elems + 2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48,&value->second);
  _Var5._M_head._M_next = (_Fwd_list_node_base)operator_new(0x30);
  ((_Fwd_list_node_base *)((long)_Var5._M_head._M_next + 8))->_M_next = p_Var2;
  ((_Fwd_list_node_base *)((long)_Var5._M_head._M_next + 0x10))->_M_next = p_Var3;
  ((_Fwd_list_node_base *)((long)_Var5._M_head._M_next + 0x18))->_M_next =
       (_Fwd_list_node_base *)local_48._0_8_;
  ((_Fwd_list_node_base *)((long)_Var5._M_head._M_next + 0x20))->_M_next =
       (_Fwd_list_node_base *)local_48._8_8_;
  ((_Fwd_list_node_base *)((long)_Var5._M_head._M_next + 0x28))->_M_next =
       (_Fwd_list_node_base *)local_38;
  local_48 = (undefined1  [16])0x0;
  local_38 = (pointer)0x0;
  *(_Fwd_list_node_base **)_Var5._M_head._M_next =
       (_Fwd_list_node_base *)
       pfVar9[uVar7].
       super__Fwd_list_base<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ._M_impl._M_head;
  pfVar9[uVar7].
  super__Fwd_list_base<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::array<int,_4UL>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl._M_head = _Var5._M_head._M_next;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  this->size_ = this->size_ + 1;
  puVar1 = (this->bucket_sizes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + uVar7;
  *puVar1 = *puVar1 + 1;
  bVar6 = true;
  sVar4 = 0;
LAB_00106f3e:
  (__return_storage_ptr__->first).hashmap_ = this;
  (__return_storage_ptr__->first).bucket_ = uVar7;
  (__return_storage_ptr__->first).position_ = sVar4;
  __return_storage_ptr__->second = bVar6;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(const std::pair<K, V>& value) {
        if (size_ / table_.size() > MAX_AVERAGE_BUCKET_SIZE)
            rehash(2 * table_.size());

        const K& key = value.first;
        const unsigned bucket = anna_hash<K>::hash(key) % table_.size();

        int position = 0;
        for (const auto& kv : table_[bucket]) {
            if (kv.first == key) {
                return {iterator(this, bucket, position), false};
            }
            ++position;
        }

        table_[bucket].push_front(value);
        ++size_;
        ++bucket_sizes_[bucket];

        return {iterator(this, bucket, 0), true};
    }